

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte.h
# Opt level: O1

void __thiscall merlin::cte::~cte(cte *this)

{
  edge *this_00;
  pointer piVar1;
  pointer puVar2;
  pointer ppeVar3;
  pointer ppeVar4;
  
  (this->super_graphical_model)._vptr_graphical_model = (_func_int **)&PTR__cte_0018fa18;
  (this->super_algorithm)._vptr_algorithm = (_func_int **)&DAT_0018fab0;
  ppeVar3 = (this->m_edges).
            super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppeVar4 = (this->m_edges).
                 super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppeVar4 != ppeVar3;
      ppeVar4 = ppeVar4 + 1) {
    this_00 = *ppeVar4;
    if (this_00 != (edge *)0x0) {
      factor::~factor(&this_00->bwd);
      factor::~factor(&this_00->fwd);
      variable_set::~variable_set(&this_00->sepset);
      operator_delete(this_00);
    }
    ppeVar3 = (this->m_edges).
              super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  ppeVar4 = (this->m_edges).
            super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppeVar3 != ppeVar4) {
    (this->m_edges).
    super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppeVar4;
  }
  ppeVar4 = (this->m_messages).
            super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_messages).
      super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppeVar4) {
    (this->m_messages).
    super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppeVar4;
  }
  piVar1 = (this->m_var2clique).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  ppeVar4 = (this->m_messages).
            super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppeVar4 != (pointer)0x0) {
    operator_delete(ppeVar4);
  }
  ppeVar4 = (this->m_edges).
            super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppeVar4 != (pointer)0x0) {
    operator_delete(ppeVar4);
  }
  std::vector<merlin::detail::node,_std::allocator<merlin::detail::node>_>::~vector
            (&this->m_clusters);
  piVar1 = (this->m_evidence).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  factor::~factor(&this->m_marginal);
  puVar2 = (this->m_query).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector(&this->m_beliefs);
  puVar2 = (this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  graphical_model::~graphical_model(&this->m_gmo);
  graphical_model::~graphical_model(&this->super_graphical_model);
  return;
}

Assistant:

~cte() {
		for (std::vector<detail::edge*>::iterator i = m_edges.begin();
				i != m_edges.end(); ++i) {
			delete *i;
		}
		m_edges.clear();
		m_messages.clear();
	}